

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_encode_array_item
              (AMQP_VALUE item,_Bool first_element,AMQPVALUE_ENCODER_OUTPUT encoder_output,
              void *context)

{
  char *pcVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  size_t sVar5;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar6;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t array_size;
  uint32_t map_size;
  uint32_t list_size;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  void *pvStack_28;
  int result;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  AMQP_VALUE pAStack_10;
  _Bool first_element_local;
  AMQP_VALUE item_local;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pvStack_28 = context;
  context_local = encoder_output;
  encoder_output_local._7_1_ = first_element;
  pAStack_10 = item;
  if ((item == (AMQP_VALUE)0x0) || (encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0)) {
    value_data = (AMQP_VALUE_DATA *)xlogging_get_log_function();
    if (value_data != (AMQP_VALUE_DATA *)0x0) {
      (*(code *)value_data)
                (0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                 ,"amqpvalue_encode_array_item",0x11a7,1,
                 "Bad arguments: item = %p, encoder_output = %p",pAStack_10,context_local);
    }
    l._4_4_ = 0x11a8;
  }
  else {
    l_1 = (LOGGER_LOG)item;
    switch(item->type) {
    case AMQP_TYPE_NULL:
      if ((first_element) && (iVar4 = encode_null_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x11b8;
      }
      else {
        l._4_4_ = encode_null_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28);
      }
      break;
    case AMQP_TYPE_BOOL:
      if ((first_element) &&
         (iVar4 = encode_boolean_constructor(encoder_output,context), iVar4 != 0)) {
        l._4_4_ = 0x11c1;
      }
      else {
        l._4_4_ = encode_boolean_value
                            ((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                             (_Bool)((byte)l_1[8] & 1));
      }
      break;
    case AMQP_TYPE_UBYTE:
      if ((first_element) && (iVar4 = encode_ubyte_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x11ca;
      }
      else {
        l._4_4_ = encode_ubyte_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                     (uchar)l_1[8]);
      }
      break;
    case AMQP_TYPE_USHORT:
      if ((first_element) && (iVar4 = encode_ushort_constructor(encoder_output,context), iVar4 != 0)
         ) {
        l._4_4_ = 0x11d3;
      }
      else {
        l._4_4_ = encode_ushort_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                      *(uint16_t *)(l_1 + 8));
      }
      break;
    case AMQP_TYPE_UINT:
      if ((first_element) &&
         (iVar4 = encode_uint_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x11dc;
      }
      else {
        l._4_4_ = encode_uint_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                    *(uint32_t *)(l_1 + 8),false);
      }
      break;
    case AMQP_TYPE_ULONG:
      if ((first_element) &&
         (iVar4 = encode_ulong_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x11e5;
      }
      else {
        l._4_4_ = encode_ulong_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                     *(uint64_t *)(l_1 + 8),false);
      }
      break;
    case AMQP_TYPE_BYTE:
      if ((first_element) && (iVar4 = encode_byte_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x11ee;
      }
      else {
        l._4_4_ = encode_byte_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,(char)l_1[8])
        ;
      }
      break;
    case AMQP_TYPE_SHORT:
      if ((first_element) && (iVar4 = encode_short_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x11f7;
      }
      else {
        l._4_4_ = encode_short_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                     *(int16_t *)(l_1 + 8));
      }
      break;
    case AMQP_TYPE_INT:
      if ((first_element) &&
         (iVar4 = encode_int_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1200;
      }
      else {
        l._4_4_ = encode_int_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                   *(int32_t *)(l_1 + 8),false);
      }
      break;
    case AMQP_TYPE_LONG:
      if ((first_element) &&
         (iVar4 = encode_long_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1209;
      }
      else {
        l._4_4_ = encode_long_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                    *(int64_t *)(l_1 + 8),false);
      }
      break;
    case AMQP_TYPE_FLOAT:
      if ((first_element) && (iVar4 = encode_float_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x1212;
      }
      else {
        l._4_4_ = encode_float_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                     *(float *)(l_1 + 8));
      }
      break;
    case AMQP_TYPE_DOUBLE:
      if ((first_element) && (iVar4 = encode_double_constructor(encoder_output,context), iVar4 != 0)
         ) {
        l._4_4_ = 0x121b;
      }
      else {
        l._4_4_ = encode_double_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                      *(double *)(l_1 + 8));
      }
      break;
    default:
      _map_size = xlogging_get_log_function();
      if (_map_size != (LOGGER_LOG)0x0) {
        (*_map_size)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                     ,"amqpvalue_encode_array_item",0x11b1,1,"Unsupported array type: %d",
                     CONCAT44(uVar6,*(undefined4 *)l_1));
      }
      l._4_4_ = 0x11b2;
      break;
    case AMQP_TYPE_TIMESTAMP:
      if ((first_element) &&
         (iVar4 = encode_timestamp_constructor(encoder_output,context), iVar4 != 0)) {
        l._4_4_ = 0x1224;
      }
      else {
        l._4_4_ = encode_timestamp_value
                            ((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                             *(int64_t *)(l_1 + 8));
      }
      break;
    case AMQP_TYPE_UUID:
      if ((first_element) && (iVar4 = encode_uuid_constructor(encoder_output,context), iVar4 != 0))
      {
        l._4_4_ = 0x122d;
      }
      else {
        l._4_4_ = encode_uuid_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                    (uchar *)(l_1 + 8));
      }
      break;
    case AMQP_TYPE_BINARY:
      if ((first_element) &&
         (iVar4 = encode_binary_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1236;
      }
      else {
        l._4_4_ = encode_binary_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                      *(uchar **)(l_1 + 8),*(uint32_t *)(l_1 + 0x10),false);
      }
      break;
    case AMQP_TYPE_STRING:
      if ((first_element) &&
         (iVar4 = encode_string_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x123f;
      }
      else {
        pvVar3 = context_local;
        pvVar2 = pvStack_28;
        pcVar1 = *(char **)(l_1 + 8);
        sVar5 = strlen(*(char **)(l_1 + 8));
        l._4_4_ = encode_string_value((AMQPVALUE_ENCODER_OUTPUT)pvVar3,pvVar2,pcVar1,sVar5,false);
      }
      break;
    case AMQP_TYPE_SYMBOL:
      if ((first_element) &&
         (iVar4 = encode_symbol_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1248;
      }
      else {
        pvVar3 = context_local;
        pvVar2 = pvStack_28;
        pcVar1 = *(char **)(l_1 + 8);
        sVar5 = strlen(*(char **)(l_1 + 8));
        l._4_4_ = encode_symbol_value((AMQPVALUE_ENCODER_OUTPUT)pvVar3,pvVar2,pcVar1,sVar5,false);
      }
      break;
    case AMQP_TYPE_LIST:
      if ((first_element) &&
         (iVar4 = encode_list_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1254;
      }
      else {
        iVar4 = amqpvalue_get_encoded_list_size
                          (*(AMQP_VALUE **)(l_1 + 8),*(uint32_t *)(l_1 + 0x10),&array_size);
        if (iVar4 == 0) {
          l._4_4_ = encode_list_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                      *(uint32_t *)(l_1 + 0x10),array_size,*(AMQP_VALUE **)(l_1 + 8)
                                      ,false);
        }
        else {
          l._4_4_ = 0x1258;
        }
      }
      break;
    case AMQP_TYPE_MAP:
      if ((first_element) &&
         (iVar4 = encode_map_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x1267;
      }
      else {
        iVar4 = amqpvalue_get_encoded_map_size
                          (*(AMQP_MAP_KEY_VALUE_PAIR **)(l_1 + 8),*(uint32_t *)(l_1 + 0x10),
                           &local_50);
        if (iVar4 == 0) {
          l._4_4_ = encode_map_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                     *(uint32_t *)(l_1 + 0x10),local_50,
                                     *(AMQP_MAP_KEY_VALUE_PAIR **)(l_1 + 8),false);
        }
        else {
          l._4_4_ = 0x126b;
        }
      }
      break;
    case AMQP_TYPE_ARRAY:
      if ((first_element) &&
         (iVar4 = encode_array_constructor(encoder_output,context,false), iVar4 != 0)) {
        l._4_4_ = 0x127a;
      }
      else {
        iVar4 = amqpvalue_get_encoded_array_size
                          (*(AMQP_VALUE **)(l_1 + 8),*(uint32_t *)(l_1 + 0x10),&local_54);
        if (iVar4 == 0) {
          l._4_4_ = encode_array_value((AMQPVALUE_ENCODER_OUTPUT)context_local,pvStack_28,
                                       *(uint32_t *)(l_1 + 0x10),local_54,*(AMQP_VALUE **)(l_1 + 8),
                                       false);
        }
        else {
          l._4_4_ = 0x127e;
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

static int amqpvalue_encode_array_item(AMQP_VALUE item, bool first_element, AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context)
{
    int result;

    if ((item == NULL) ||
        (encoder_output == NULL))
    {
        LogError("Bad arguments: item = %p, encoder_output = %p", item, encoder_output);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)item;

        switch (value_data->type)
        {
            default:
                LogError("Unsupported array type: %d", (int)value_data->type);
                result = MU_FAILURE;
                break;

            case AMQP_TYPE_NULL:
                if ((first_element) && (encode_null_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_null_value(encoder_output, context);
                break;

            case AMQP_TYPE_BOOL:
                if ((first_element) && (encode_boolean_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_boolean_value(encoder_output, context, value_data->value.bool_value);
                break;

            case AMQP_TYPE_UBYTE:
                if ((first_element) && (encode_ubyte_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ubyte_value(encoder_output, context, value_data->value.ubyte_value);
                break;

            case AMQP_TYPE_USHORT:
                if ((first_element) && (encode_ushort_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ushort_value(encoder_output, context, value_data->value.ushort_value);
                break;

            case AMQP_TYPE_UINT:
                if ((first_element) && (encode_uint_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_uint_value(encoder_output, context, value_data->value.uint_value, false);
                break;

            case AMQP_TYPE_ULONG:
                if ((first_element) && (encode_ulong_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_ulong_value(encoder_output, context, value_data->value.ulong_value, false);
                break;

            case AMQP_TYPE_BYTE:
                if ((first_element) && (encode_byte_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_byte_value(encoder_output, context, value_data->value.byte_value);
                break;

            case AMQP_TYPE_SHORT:
                if ((first_element) && (encode_short_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_short_value(encoder_output, context, value_data->value.short_value);
                break;

            case AMQP_TYPE_INT:
                if ((first_element) && (encode_int_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_int_value(encoder_output, context, value_data->value.int_value, false);
                break;

            case AMQP_TYPE_LONG:
                if ((first_element) && (encode_long_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_long_value(encoder_output, context, value_data->value.long_value, false);
                break;

            case AMQP_TYPE_FLOAT:
                if ((first_element) && (encode_float_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_float_value(encoder_output, context, value_data->value.float_value);
                break;

            case AMQP_TYPE_DOUBLE:
                if ((first_element) && (encode_double_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_double_value(encoder_output, context, value_data->value.double_value);
                break;

            case AMQP_TYPE_TIMESTAMP:
                if ((first_element) && (encode_timestamp_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_timestamp_value(encoder_output, context, value_data->value.timestamp_value);
                break;

            case AMQP_TYPE_UUID:
                if ((first_element) && (encode_uuid_constructor(encoder_output, context) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_uuid_value(encoder_output, context, value_data->value.uuid_value);
                break;

            case AMQP_TYPE_BINARY:
                if ((first_element) && (encode_binary_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_binary_value(encoder_output, context, (const unsigned char*)value_data->value.binary_value.bytes, value_data->value.binary_value.length, false);
                break;

            case AMQP_TYPE_STRING:
                if ((first_element) && (encode_string_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_string_value(encoder_output, context, value_data->value.string_value.chars, strlen(value_data->value.string_value.chars), false);
                break;

            case AMQP_TYPE_SYMBOL:
                if ((first_element) && (encode_symbol_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                    break;
                }
                result = encode_symbol_value(encoder_output, context, value_data->value.symbol_value.chars, strlen(value_data->value.symbol_value.chars), false);
                break;

            case AMQP_TYPE_LIST:
            {
                uint32_t list_size;

                if ((first_element) && (encode_list_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_list_size(value_data->value.list_value.items, value_data->value.list_value.count, &list_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_list_value(encoder_output, context, value_data->value.list_value.count, list_size, value_data->value.list_value.items, false);
                }
                break;
            }

            case AMQP_TYPE_MAP:
            {
                uint32_t map_size;

                if ((first_element) && (encode_map_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_map_size(value_data->value.map_value.pairs, value_data->value.map_value.pair_count, &map_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_map_value(encoder_output, context, value_data->value.map_value.pair_count, map_size, value_data->value.map_value.pairs, false);
                }
                break;
            }

            case AMQP_TYPE_ARRAY:
            {
                uint32_t array_size;

                if ((first_element) && (encode_array_constructor(encoder_output, context, false) != 0))
                {
                    result = MU_FAILURE;
                }
                else if (amqpvalue_get_encoded_array_size(value_data->value.array_value.items, value_data->value.array_value.count, &array_size) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = encode_array_value(encoder_output, context, value_data->value.array_value.count, array_size, value_data->value.array_value.items, false);
                }
                break;
            }
        }
    }
    return result;
}